

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O3

unsigned_long anon_unknown.dwarf_8ba60::roundtrip<unsigned_long>(unsigned_long *in)

{
  long lVar1;
  Result *in_R9;
  unsigned_long out;
  stringstream stream;
  undefined1 auStack_1d8 [4];
  ExpressionDecomposer local_1d4;
  Expression_lhs<unsigned_long> local_1d0;
  Result local_1c0;
  unsigned_long local_1a0;
  long local_198 [2];
  char local_188 [12];
  undefined4 auStack_17c [25];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  lVar1 = *(long *)(local_198[0] + -0x18);
  *(undefined4 *)((long)auStack_17c + lVar1) = 4;
  std::ios::clear((int)auStack_1d8 + (int)lVar1 + 0x40);
  local_1c0._0_8_ = *in;
  std::ostream::write(local_188,(long)&local_1c0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1d4,DT_CHECK);
  local_1d0.lhs = std::ostream::tellp();
  local_1d0.m_at = local_1d4.m_at;
  local_1a0 = 8;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c0,&local_1d0,&local_1a0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b61dc,(char *)0x36,0x1b643d,&local_1c0.m_passed,in_R9);
  doctest::String::~String(&local_1c0.m_decomp);
  std::istream::read((char *)local_198,(long)&local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return local_1d0.lhs;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}